

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanBGPlanner.cpp
# Opt level: O2

VectorSet * __thiscall
MonahanBGPlanner::ComputeGaoa
          (MonahanBGPlanner *this,GaoVectorSet *Gao,ValueFunctionPOMDPDiscrete *V,Index a,Index o,
          Index aPrime)

{
  double dVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar3;
  pointer pAVar4;
  undefined1 auVar5 [16];
  size_t sVar6;
  PlanningUnitDecPOMDPDiscrete *pPVar7;
  undefined8 uVar8;
  reference pvVar9;
  VectorSet *pVVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong __n;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM2 [16];
  allocator_type local_8d;
  Index local_8c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  v;
  vector<double,_std::allocator<double>_> v1;
  
  v.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
  if (pPVar7 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
  }
  pDVar2 = pPVar7->_m_DecPOMDP;
  pmVar3 = (Gao->
           super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
           ).
           super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
           .base_[(Gao->
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  ).
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .origin_offset_ +
                  (ulong)a *
                  (Gao->
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  ).
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .stride_list_.elems[0] +
                  (ulong)o *
                  (Gao->
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  ).
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .stride_list_.elems[1]];
  uVar14 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0)) +
                       0x70))((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0));
  uVar11 = 0;
  local_8c = aPrime;
  while( true ) {
    pAVar4 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = (ulong)uVar11;
    if (((long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pAVar4) / 0x28 == uVar12) break;
    if (pAVar4[uVar12]._m_action == aPrime) {
      pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
      if (pPVar7 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
      }
      sVar6 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar7->super_PlanningUnitMADPDiscrete);
      std::vector<double,_std::allocator<double>_>::vector(&v1,sVar6,&local_8d);
      uVar13 = 0;
      while( true ) {
        pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
        if (pPVar7 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
        }
        sVar6 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar7->super_PlanningUnitMADPDiscrete);
        __n = (ulong)uVar13;
        if (sVar6 == __n) break;
        pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
        if (pPVar7 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
        }
        dVar15 = (double)(**(code **)(*(long *)pPVar7->_m_DecPOMDP + 0xc0))
                                   (pPVar7->_m_DecPOMDP,__n,a);
        pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
        if (pPVar7 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar7 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
        }
        uVar8 = (**(code **)((long)*(pPVar7->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
        dVar1 = (pmVar3->data_).data_[pmVar3->size2_ * uVar12 + __n];
        pvVar9 = std::vector<double,_std::allocator<double>_>::at(&v1,__n);
        auVar5 = vcvtusi2sd_avx512f(in_XMM2,uVar8);
        uVar13 = uVar13 + 1;
        auVar16._0_8_ = dVar15 / auVar5._0_8_;
        auVar16._8_8_ = 0;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar1;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar14;
        auVar5 = vfmadd132sd_fma(auVar17,auVar16,auVar5);
        *pvVar9 = auVar5._0_8_;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&v,(value_type *)&v1.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&v1.super__Vector_base<double,_std::allocator<double>_>);
      aPrime = local_8c;
    }
    uVar11 = uVar11 + 1;
  }
  pVVar10 = AlphaVectorPlanning::VectorOfVectorsToVectorSet(&v);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&v);
  return pVVar10;
}

Assistant:

VectorSet* MonahanBGPlanner::ComputeGaoa(const GaoVectorSet &Gao,
                                         const ValueFunctionPOMDPDiscrete &V,
                                         Index a,
                                         Index o,
                                         Index aPrime) const
{
    vector<vector<double> > v;
    //for the current a,o, beta, we are now going to construct a set of vectors...
    //  Note: the tech-report specifies the value for a (joint) belief. Therefore
    //  it is possible to select the maximizing back-projected vector (g_ao^v') in
    //  (3.22).
    //
    //  In contrast, here we are generating the the vectors over the complete 
    //  joint belief space. As such, we can not generate the vector 
    //  v*_{b,a,\beta} as done in (3.22). Instead we generate the set of possible
    //      v_{a,\beta}^k   = R_a + \sum_{o} g_{ao}^v'[k] 
    //                      = \sum_{o} [  (R_a / |o|) +  g_{ao}^v'[k]  ]      (A)
    //                                    ==========================
    //                                           
    //  
    //  (   Note that, because each \beta will specify at least one different joint action
    //      (for one joint observation), the set of v_{a,\beta}^k vectors generated for 
    //      different \beta are in fact different.                                            ) 
    //
    //!!HOWEVER!! these vectors that are called 'v1' below corresponds to the  
    //  part of (A) in brackets. It just adds (an 1/|o| fraction of) the immediate
    //  reward to  g_{ao}^v[k], which is just some back projected vector. Let us call 
    //  this new function 'rg'. I.e.:
    //
    //      rg_ao^k = (R_a / |o|) +  g_{ao}^v'[k]
    //
    //  while it is the case that each \beta will only be consistent with a subset of these
    //  vectors, it is *NOT* the case that each \beta specifies completely different sets of
    //  rg vectors!!!
    //
    //  As such, it does not make sense to have G[a][o][betaI] store sets of rg_ao^k,
    //  many of which contain duplicates!
    //
    //  INSTEAD I propose the following:
    //      1) store G[a][o][a'], the set of rg_ao^k such that v'[k] specifies a'
    //      2) then in 'cross-sum' only loop over the a' consistent with the jpol
    //

    //a pointer used to point to different vectors in Gao
    VectorSet *vGao=Gao[a][o];
    double gamma=GetPU()->GetDiscount();

    for(Index k=0;k!=V.size();k++) //for each vector v[k] in V^t+1
    {
        //if the vector V[k] specifies the joint action that is consistent with \beta (see (3.15))
        if(V[k].GetAction()==aPrime)
        {
            vector<double> v1(GetPU()->GetNrStates());
            for(Index s=0;s!=GetPU()->GetNrStates();s++)
            {
                //the immediate reward is divided equally over the vectors:   
                double R_s_a_o = (GetPU()->GetReward(s,a)) / GetPU()->GetNrJointObservations();
                
                //the following is just one of the vectors g_ao^v[k] (g_{ao}^{v^{t+1}_a'}) from (3.15)
                double g_a_o_vk_s =  (*vGao)(k,s);
                v1.at(s) =  R_s_a_o + gamma * g_a_o_vk_s;
            }
            v.push_back(v1);
        }
    }
    return(VectorOfVectorsToVectorSet(v));
}